

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_button.cpp
# Opt level: O0

void Am_Inter_For_Panel_Do_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  byte local_104;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  byte local_a9;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  undefined1 local_88 [8];
  Am_Value cmd_obj_value;
  Am_Value new_value;
  Am_Value old_value;
  Am_Object inter;
  Am_Object parent_command;
  Am_Object panel_command;
  Am_Object panel;
  Am_Object item_command;
  Am_Object local_20;
  Am_Object item;
  Am_Object new_object;
  Am_Object *command_obj_local;
  
  Am_Object::Am_Object(&item);
  Am_Object::Am_Object(&local_20);
  Am_Object::Am_Object(&panel);
  Am_Object::Am_Object(&panel_command);
  Am_Object::Am_Object(&parent_command);
  Am_Object::Am_Object(&inter);
  Am_Object::Get_Owner((Am_Object *)&old_value.value,(Am_Slot_Flags)command_obj);
  Am_Value::Am_Value((Am_Value *)&new_value.value);
  Am_Value::Am_Value((Am_Value *)&cmd_obj_value.value);
  Am_Value::Am_Value((Am_Value *)local_88);
  bVar1 = Am_Object::Valid((Am_Object *)&old_value.value);
  if (bVar1) {
    Am_Object::Get_Owner(&local_90,(Am_Slot_Flags)&old_value.value);
    Am_Object::operator=(&panel_command,&local_90);
    Am_Object::~Am_Object(&local_90);
    pAVar2 = Am_Object::Peek(&panel_command,0x169,0);
    Am_Value::operator=((Am_Value *)&new_value.value,pAVar2);
    Am_Object::Set(&panel_command,0x16c,(Am_Value *)&new_value.value,0);
    Am_Object::Am_Object(&local_98,(Am_Object *)&old_value.value);
    set_panel_value_from_inter_value(&local_98);
    Am_Object::~Am_Object(&local_98);
    pAVar2 = Am_Object::Peek(&panel_command,0x169,0);
    Am_Value::operator=((Am_Value *)&cmd_obj_value.value,pAVar2);
    Am_Object::Set(command_obj,0x16c,(Am_Value *)&new_value.value,0);
    Am_Object::Set(command_obj,0x169,(Am_Value *)&cmd_obj_value.value,0);
    pAVar2 = Am_Object::Get((Am_Object *)&old_value.value,0x16a,0);
    Am_Object::operator=(&item,pAVar2);
    bVar1 = Am_Object::Valid(&panel_command);
    if (bVar1) {
      pAVar2 = Am_Object::Peek(&panel_command,0xc5,0);
      Am_Value::operator=((Am_Value *)local_88,pAVar2);
      if (local_88._0_2_ == 0xa001) {
        Am_Object::operator=(&parent_command,(Am_Value *)local_88);
        Am_Object::Am_Object(&local_a0,&Am_Command);
        bVar1 = Am_Object::Is_Instance_Of(&parent_command,&local_a0);
        Am_Object::~Am_Object(&local_a0);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          Am_Object::operator=(&parent_command,&Am_No_Object);
        }
      }
    }
    local_a9 = 0;
    bVar1 = Am_Object::Valid(&item);
    local_104 = 0;
    if (bVar1) {
      Am_Object::Am_Object(&local_a8,&Am_Menu_In_Scrolling_Menu);
      local_a9 = 1;
      bVar1 = Am_Object::Is_Instance_Of(&panel_command,&local_a8);
      local_104 = bVar1 ^ 0xff;
    }
    if ((local_a9 & 1) != 0) {
      Am_Object::~Am_Object(&local_a8);
    }
    if ((local_104 & 1) != 0) {
      pAVar2 = Am_Object::Peek(&item,0xc5,0);
      Am_Value::operator=((Am_Value *)local_88,pAVar2);
      if (local_88._0_2_ == 0xa001) {
        Am_Object::operator=(&panel,(Am_Value *)local_88);
        Am_Object::Am_Object(&local_b8,&Am_Command);
        bVar1 = Am_Object::Is_Instance_Of(&panel,&local_b8);
        Am_Object::~Am_Object(&local_b8);
        if (bVar1) {
          Am_Object::operator=(&local_20,&item);
          Am_Object::operator=(&inter,&panel);
          Am_Object::Am_Object(&local_c0,(Am_Object *)&old_value.value);
          Am_Object::Am_Object(&local_c8,&item);
          bVar1 = inter_value_is_or_contains(&local_c0,&local_c8);
          Am_Object::~Am_Object(&local_c8);
          Am_Object::~Am_Object(&local_c0);
          if (bVar1) {
            pAVar2 = Am_Object::Peek(&item,0x1af,0);
            Am_Value::operator=((Am_Value *)&cmd_obj_value.value,pAVar2);
          }
          else {
            Am_Value::operator=((Am_Value *)&cmd_obj_value.value,0);
          }
        }
        else {
          Am_Object::operator=(&panel,&Am_No_Object);
        }
      }
    }
    bVar1 = Am_Object::Valid(&panel);
    if ((!bVar1) && (bVar1 = Am_Object::Valid(&parent_command), bVar1)) {
      Am_Object::operator=(&inter,&parent_command);
      pAVar2 = Am_Object::Peek(&panel_command,0x169,0);
      Am_Value::operator=((Am_Value *)&cmd_obj_value.value,pAVar2);
    }
    pAVar2 = Am_Object::Peek(&inter,0x169,0);
    Am_Value::operator=((Am_Value *)&new_value.value,pAVar2);
    Am_Object::Set(&inter,0x16c,(Am_Value *)&new_value.value,0);
    Am_Object::Set(&inter,0x169,(Am_Value *)&cmd_obj_value.value,0);
    value = Am_Object::operator_cast_to_Am_Wrapper_(&inter);
    Am_Object::Set(command_obj,0x154,value,0);
  }
  Am_Value::~Am_Value((Am_Value *)local_88);
  Am_Value::~Am_Value((Am_Value *)&cmd_obj_value.value);
  Am_Value::~Am_Value((Am_Value *)&new_value.value);
  Am_Object::~Am_Object((Am_Object *)&old_value.value);
  Am_Object::~Am_Object(&inter);
  Am_Object::~Am_Object(&parent_command);
  Am_Object::~Am_Object(&panel_command);
  Am_Object::~Am_Object(&panel);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&item);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Inter_For_Panel_Do,
                 (Am_Object command_obj))
{
  Am_Object new_object, item, item_command, panel, panel_command,
      parent_command;
  Am_Object inter = command_obj.Get_Owner(); // owner will be interactor
  Am_Value old_value, new_value, cmd_obj_value;
  if (inter.Valid()) {
    //get old_value
    panel = inter.Get_Owner(); // panel the interactor is in
    old_value = panel.Peek(Am_VALUE);
    panel.Set(Am_OLD_VALUE, old_value);
    set_panel_value_from_inter_value(inter);
    //set command_obj's slots
    new_value = panel.Peek(Am_VALUE);
    command_obj.Set(Am_OLD_VALUE, old_value);
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                         "++ DO method setting the Am_VALUE of "
                             << command_obj << " to " << new_value);
    command_obj.Set(Am_VALUE, new_value);

    new_object = inter.Get(Am_INTERIM_VALUE);
    // new_object is a sub-widget (an individual button)
    if (panel.Valid()) {
      cmd_obj_value = panel.Peek(Am_COMMAND);
      if (cmd_obj_value.type == Am_OBJECT) {
        panel_command = cmd_obj_value;
        if (!(panel_command.Is_Instance_Of(Am_Command)))
          panel_command = Am_No_Object;
      }
    }

    if (new_object.Valid() &&
        !panel.Is_Instance_Of(Am_Menu_In_Scrolling_Menu)) {
      // for scrolling menus, don't ever want to use the sub-item's command
      // object's method
      cmd_obj_value = new_object.Peek(Am_COMMAND);
      if (cmd_obj_value.type == Am_OBJECT) {
        item_command = cmd_obj_value;
        if (item_command.Is_Instance_Of(Am_Command)) {
          item = new_object;
          parent_command = item_command;
          //set the value of the item_command to the item's label_or_id or 0
          if (inter_value_is_or_contains(inter, new_object))
            new_value = new_object.Peek(Am_LABEL_OR_ID);
          else
            new_value = 0;
        } else
          item_command = Am_No_Object; // wrong type object
      }
    }
    if (!item_command.Valid()) { //not in the item, try to find a global cmd
      if (panel_command.Valid()) {
        parent_command = panel_command;
        //set the value of the panel_command to be the same as the panel's
        new_value = panel.Peek(Am_VALUE);
      }
    }
    old_value = parent_command.Peek(Am_VALUE);
    parent_command.Set(Am_OLD_VALUE, old_value);
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                         "++ DO method setting the Am_VALUE of parent "
                             << parent_command << " to " << new_value);
    parent_command.Set(Am_VALUE, new_value);

    // set my parent to either the item's or panel's command object
    command_obj.Set(Am_IMPLEMENTATION_PARENT, parent_command);
  }
}